

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color_set.c
# Opt level: O2

int mpt_color_pset(mpt_color *col,mpt_convertable *src)

{
  int iVar1;
  uint uVar2;
  char *in_RAX;
  char *txt;
  
  if (src == (mpt_convertable *)0x0) {
    uVar2 = (uint)(*col != (mpt_color)0xff);
  }
  else {
    txt = in_RAX;
    iVar1 = mpt_color_typeid();
    if ((0 < iVar1) && (iVar1 = (*src->_vptr->convert)(src,(mpt_type_t)iVar1,col), -1 < iVar1)) {
      return 0;
    }
    iVar1 = (*src->_vptr->convert)(src,0x73,&txt);
    if (iVar1 < 0) {
      uVar2 = 0xfffffffd;
    }
    else {
      iVar1 = mpt_color_parse(col,txt);
      uVar2 = iVar1 >> 0x1f & 0xfffffffe;
    }
  }
  return uVar2;
}

Assistant:

extern int mpt_color_pset(MPT_STRUCT(color) *col, MPT_INTERFACE(convertable) *src)
{
	const char *txt;
	int type;
	int len;
	
	if (!src) {
		/* default color is black, no transparency */
		static const MPT_STRUCT(color) tcol = MPT_COLOR_INIT;
		return memcmp(&tcol, col, sizeof(*col)) ? 1 : 0;
	}
	if ((type = mpt_color_typeid()) > 0
	 && (len = src->_vptr->convert(src, type, col)) >= 0) {
		return 0;
	}
	/* parse color name/format  */
	if ((len = src->_vptr->convert(src, 's', &txt)) >= 0) {
		int take;
		if ((take = mpt_color_parse(col, txt)) < 0) {
			return MPT_ERROR(BadValue);
		}
		return 0;
	}
	return MPT_ERROR(BadType);
}